

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain_pdf2(Impl *this,Value *pnext,void **outpNext)

{
  bool bVar1;
  VkStructureType VVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar3;
  Type this_01;
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar4;
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar5;
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar6;
  long *in_FS_OFFSET;
  VkPhysicalDeviceRobustness2FeaturesEXT *robustness2;
  Impl *local_40;
  void **local_38;
  
  local_40 = this;
  local_38 = outpNext;
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(pnext);
  pVVar5 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
  pVVar6 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
  do {
    pGVar3 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(pnext);
    if (this_00 == pGVar3) {
      *local_38 = pVVar6;
LAB_0014cbc5:
      return this_00 == pGVar3;
    }
    this_01 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"sType");
    VVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(this_01);
    if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_mesh_shader_features_nv
                (local_40,(Value *)this_00,(VkPhysicalDeviceMeshShaderFeaturesNV **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_fragment_shading_rate_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDeviceFragmentShadingRateFeaturesKHR **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_shader_object_features
                (local_40,(Value *)this_00,(VkPhysicalDeviceShaderObjectFeaturesEXT **)&robustness2)
      ;
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_descriptor_buffer_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDeviceDescriptorBufferFeaturesEXT **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_fragment_shading_rate_enums_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_mesh_shader_features
                (local_40,(Value *)this_00,(VkPhysicalDeviceMeshShaderFeaturesEXT **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_image_robustness_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDeviceImageRobustnessFeaturesEXT **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_primitives_generated_query_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **)&robustness2);
    }
    else if (VVar2 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_2d_view_of_3d_features
                (local_40,(Value *)this_00,
                 (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **)&robustness2);
    }
    else {
      if (VVar2 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
        if (*(int *)(*in_FS_OFFSET + -0x20) < 3) {
          bVar1 = Internal::log_thread_callback
                            (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",(ulong)VVar2);
          if (!bVar1) {
            fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                    (ulong)VVar2);
          }
        }
        goto LAB_0014cbc5;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      parse_robustness2_features(local_40,(Value *)this_00,&robustness2);
    }
    robustness2->sType = VVar2;
    robustness2->pNext = (void *)0x0;
    pVVar4 = robustness2;
    if (pVVar5 != (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0) {
      pVVar5->pNext = robustness2;
      pVVar4 = pVVar6;
    }
    this_00 = this_00 + 0x10;
    pVVar5 = robustness2;
    pVVar6 = pVVar4;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain_pdf2(const Value &pnext, void **outpNext)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			VkPhysicalDeviceRobustness2FeaturesEXT *robustness2 = nullptr;
			if (!parse_robustness2_features(next, &robustness2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(robustness2);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			VkPhysicalDeviceImageRobustnessFeaturesEXT *image_robustness = nullptr;
			if (!parse_image_robustness_features(next, &image_robustness))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(image_robustness);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums = nullptr;
			if (!parse_fragment_shading_rate_enums_features(next, &fragment_shading_rate_enums))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate_enums);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate_features(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader = nullptr;
			if (!parse_mesh_shader_features(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader = nullptr;
			if (!parse_mesh_shader_features_nv(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer = nullptr;
			if (!parse_descriptor_buffer_features(next, &descriptor_buffer))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(descriptor_buffer);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object = nullptr;
			if (!parse_shader_object_features(next, &shader_object))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(shader_object);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated = nullptr;
			if (!parse_primitives_generated_query_features(next, &prim_generated))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(prim_generated);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *view_2d_of_3d = nullptr;
			if (!parse_2d_view_of_3d_features(next, &view_2d_of_3d))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(view_2d_of_3d);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}